

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

float Gia_ObjComputeArrival(Gia_Man_t *p,int iObj,int fUseSorting)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int *piVar4;
  float *pfVar5;
  float fVar6;
  float *pDelays;
  float local_138;
  float tArrival;
  float pPinDelays [32];
  int pPinPerm [32];
  int iFanin;
  int k;
  Gia_Obj_t *pObj;
  If_LibLut_t *pLutLib;
  int fUseSorting_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pLutLib;
  pObj_00 = Gia_ManObj(p,iObj);
  iVar3 = Gia_ObjIsCi(pObj_00);
  if (iVar3 == 0) {
    iVar3 = Gia_ObjIsCo(pObj_00);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsLut(p,iObj);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                      ,0x79,"float Gia_ObjComputeArrival(Gia_Man_t *, int, int)");
      }
      pDelays._4_4_ = -1e+09;
      if (pvVar1 == (void *)0x0) {
        for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
            pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
          piVar4 = Gia_ObjLutFanins(p,iObj);
          iVar3 = piVar4[pPinPerm[0x1f]];
          fVar6 = Gia_ObjTimeArrival(p,iVar3);
          if (pDelays._4_4_ < fVar6 + 1.0) {
            fVar6 = Gia_ObjTimeArrival(p,iVar3);
            pDelays._4_4_ = fVar6 + 1.0;
          }
        }
      }
      else if (*(int *)((long)pvVar1 + 0xc) == 0) {
        iVar3 = Gia_ObjLutSize(p,iObj);
        pfVar5 = (float *)((long)pvVar1 + (long)iVar3 * 0x84 + 0x94);
        for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
            pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
          piVar4 = Gia_ObjLutFanins(p,iObj);
          iVar3 = piVar4[pPinPerm[0x1f]];
          fVar6 = Gia_ObjTimeArrival(p,iVar3);
          if (pDelays._4_4_ < fVar6 + *pfVar5) {
            fVar6 = Gia_ObjTimeArrival(p,iVar3);
            pDelays._4_4_ = fVar6 + *pfVar5;
          }
        }
      }
      else {
        iVar3 = Gia_ObjLutSize(p,iObj);
        lVar2 = (long)iVar3 * 0x84 + 0x94;
        if (fUseSorting == 0) {
          for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
              pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
            piVar4 = Gia_ObjLutFanins(p,iObj);
            iVar3 = piVar4[pPinPerm[0x1f]];
            fVar6 = Gia_ObjTimeArrival(p,iVar3);
            if (pDelays._4_4_ < fVar6 + *(float *)((long)pvVar1 + (long)pPinPerm[0x1f] * 4 + lVar2))
            {
              fVar6 = Gia_ObjTimeArrival(p,iVar3);
              pDelays._4_4_ = fVar6 + *(float *)((long)pvVar1 + (long)pPinPerm[0x1f] * 4 + lVar2);
            }
          }
        }
        else {
          Gia_LutDelayTraceSortPins(p,iObj,(int *)(pPinDelays + 0x1e),&local_138);
          for (pPinPerm[0x1f] = 0; iVar3 = Gia_ObjLutSize(p,iObj), pPinPerm[0x1f] < iVar3;
              pPinPerm[0x1f] = pPinPerm[0x1f] + 1) {
            Gia_ObjLutFanins(p,iObj);
            iVar3 = Gia_ObjLutFanin(p,iObj,(int)pPinDelays[(long)pPinPerm[0x1f] + 0x1e]);
            fVar6 = Gia_ObjTimeArrival(p,iVar3);
            if (pDelays._4_4_ < fVar6 + *(float *)((long)pvVar1 + (long)pPinPerm[0x1f] * 4 + lVar2))
            {
              iVar3 = Gia_ObjLutFanin(p,iObj,(int)pPinDelays[(long)pPinPerm[0x1f] + 0x1e]);
              fVar6 = Gia_ObjTimeArrival(p,iVar3);
              pDelays._4_4_ = fVar6 + *(float *)((long)pvVar1 + (long)pPinPerm[0x1f] * 4 + lVar2);
            }
          }
        }
      }
      iVar3 = Gia_ObjLutSize(p,iObj);
      if (iVar3 == 0) {
        pDelays._4_4_ = 0.0;
      }
      p_local._4_4_ = pDelays._4_4_;
    }
    else {
      iVar3 = Gia_ObjFaninId0p(p,pObj_00);
      p_local._4_4_ = Gia_ObjTimeArrival(p,iVar3);
    }
  }
  else {
    p_local._4_4_ = Gia_ObjTimeArrival(p,iObj);
  }
  return p_local._4_4_;
}

Assistant:

float Gia_ObjComputeArrival( Gia_Man_t * p, int iObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int k, iFanin, pPinPerm[32];
    float pPinDelays[32];
    float tArrival, * pDelays;
    if ( Gia_ObjIsCi(pObj) )
        return Gia_ObjTimeArrival(p, iObj);
    if ( Gia_ObjIsCo(pObj) )
        return Gia_ObjTimeArrival(p, Gia_ObjFaninId0p(p, pObj) );
    assert( Gia_ObjIsLut(p, iObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + 1.0 )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] )
                tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        if ( fUseSorting )
        {
            Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
            Gia_LutForEachFanin( p, iObj, iFanin, k ) 
                if ( tArrival < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p,iObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( tArrival < Gia_ObjTimeArrival(p, iFanin) + pDelays[k] )
                    tArrival = Gia_ObjTimeArrival(p, iFanin) + pDelays[k];
        }
    }
    if ( Gia_ObjLutSize(p, iObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}